

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O1

LogicalType * __thiscall duckdb::LogicalGet::GetColumnType(LogicalGet *this,ColumnIndex *index)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  const_reference pvVar3;
  _Hash_node_base *p_Var4;
  InternalException *this_00;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  string local_40;
  
  p_Var4 = (_Hash_node_base *)index->index;
  if (p_Var4 < (_Hash_node_base *)0x8000000000000000) {
    pvVar3 = vector<duckdb::LogicalType,_true>::operator[](&this->returned_types,(size_type)p_Var4);
    return pvVar3;
  }
  uVar1 = (this->virtual_columns)._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var4 % uVar1;
  p_Var6 = (this->virtual_columns)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, p_Var4 != p_Var6->_M_nxt[1]._M_nxt)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var4 == p_Var2[1]._M_nxt)) goto LAB_01223a54;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_01223a54:
  if (p_Var7 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var7->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Failed to find referenced virtual column %d","");
    InternalException::InternalException<unsigned_long>(this_00,&local_40,index->index);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return (LogicalType *)(p_Var4 + 6);
}

Assistant:

const LogicalType &LogicalGet::GetColumnType(const ColumnIndex &index) const {
	if (index.IsVirtualColumn()) {
		auto entry = virtual_columns.find(index.GetPrimaryIndex());
		if (entry == virtual_columns.end()) {
			throw InternalException("Failed to find referenced virtual column %d", index.GetPrimaryIndex());
		}
		return entry->second.type;
	}
	return returned_types[index.GetPrimaryIndex()];
}